

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int expect(frozen *f,char *s,int len,json_type t)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar1 = *(int *)&f->end;
  pcVar2 = f->cur;
  iVar3 = capture_ptr(f,pcVar2,t);
  if (-1 < iVar3) {
    if (0 < len) {
      uVar5 = iVar1 - (int)pcVar2;
      uVar4 = 0;
      uVar6 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar6 = 0;
      }
      do {
        if (uVar6 == uVar4) {
          return -2;
        }
        if (f->cur[uVar4] != s[uVar4]) {
          return -1;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)len != uVar4);
    }
    pcVar2 = f->cur;
    f->cur = pcVar2 + (uint)len;
    iVar3 = capture_len(f,f->num_tokens + -1,pcVar2 + (uint)len);
    iVar3 = iVar3 >> 0x1f;
  }
  return iVar3;
}

Assistant:

static int expect(struct frozen *f, const char *s, int len, enum json_type t) {
    int i, n = left(f);

    TRY(capture_ptr(f, f->cur, t));
    for (i = 0; i < len; i++) {
        if (i >= n) return JSON_STRING_INCOMPLETE;
        if (f->cur[i] != s[i]) return JSON_STRING_INVALID;
    }
    f->cur += len;
    TRY(capture_len(f, f->num_tokens - 1, f->cur));

    return 0;
}